

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void cfd::js::api::json::UpdateTxOutAmountRequest::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>_>_>,_bool>
  pVar2;
  allocator local_239;
  string local_238 [32];
  _Base_ptr local_218;
  undefined1 local_210;
  undefined1 local_208 [64];
  function<std::__cxx11::string()> local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  _Base_ptr local_180;
  undefined1 local_178;
  undefined1 local_170 [64];
  function<std::__cxx11::string()> local_130 [39];
  allocator local_109;
  string local_108 [32];
  _Base_ptr local_e8;
  undefined1 local_e0;
  undefined1 local_c8 [64];
  function<std::__cxx11::string()> local_88 [32];
  undefined1 local_68 [8];
  CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> func_table;
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>_>_>_>
                   *)json_mapper_abi_cxx11_);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>::CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)local_68);
    std::function<std::__cxx11::string(cfd::js::api::json::UpdateTxOutAmountRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::UpdateTxOutAmountRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::UpdateTxOutAmountRequest_const&)>
                *)local_c8,GetTxString_abi_cxx11_);
    std::function<void(cfd::js::api::json::UpdateTxOutAmountRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::UpdateTxOutAmountRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::UpdateTxOutAmountRequest&,UniValue_const&)> *)
               (local_c8 + 0x20),SetTxString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_88,GetTxFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)local_c8);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)local_c8);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>>>>
            ::
            emplace<char_const(&)[3],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [3])"tx",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)
                       local_68);
    local_e8 = (_Base_ptr)pVar2.first._M_node;
    local_e0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"tx",&local_109);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::function<std::__cxx11::string(cfd::js::api::json::UpdateTxOutAmountRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::UpdateTxOutAmountRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::UpdateTxOutAmountRequest_const&)>
                *)local_170,GetIsElementsString_abi_cxx11_);
    std::function<void(cfd::js::api::json::UpdateTxOutAmountRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::UpdateTxOutAmountRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::UpdateTxOutAmountRequest&,UniValue_const&)> *)
               (local_170 + 0x20),SetIsElementsString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_130,GetIsElementsFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)local_170);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)local_170);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>>>>
            ::
            emplace<char_const(&)[11],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [11])"isElements",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)
                       local_68);
    local_180 = (_Base_ptr)pVar2.first._M_node;
    local_178 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"isElements",&local_1a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_1a0);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::function<std::__cxx11::string(cfd::js::api::json::UpdateTxOutAmountRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::UpdateTxOutAmountRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::UpdateTxOutAmountRequest_const&)>
                *)local_208,GetTxoutsString_abi_cxx11_);
    std::function<void(cfd::js::api::json::UpdateTxOutAmountRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::UpdateTxOutAmountRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::UpdateTxOutAmountRequest&,UniValue_const&)> *)
               (local_208 + 0x20),SetTxoutsString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_1c8,GetTxoutsFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)local_208);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)local_208);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>>>>
            ::
            emplace<char_const(&)[7],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [7])"txouts",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)
                       local_68);
    local_218 = (_Base_ptr)pVar2.first._M_node;
    local_210 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"txouts",&local_239);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_238);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxOutAmountRequest> *)local_68);
  }
  return;
}

Assistant:

void UpdateTxOutAmountRequest::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<UpdateTxOutAmountRequest> func_table;  // NOLINT

  func_table = {
    UpdateTxOutAmountRequest::GetTxString,
    UpdateTxOutAmountRequest::SetTxString,
    UpdateTxOutAmountRequest::GetTxFieldType,
  };
  json_mapper.emplace("tx", func_table);
  item_list.push_back("tx");
  func_table = {
    UpdateTxOutAmountRequest::GetIsElementsString,
    UpdateTxOutAmountRequest::SetIsElementsString,
    UpdateTxOutAmountRequest::GetIsElementsFieldType,
  };
  json_mapper.emplace("isElements", func_table);
  item_list.push_back("isElements");
  func_table = {
    UpdateTxOutAmountRequest::GetTxoutsString,
    UpdateTxOutAmountRequest::SetTxoutsString,
    UpdateTxOutAmountRequest::GetTxoutsFieldType,
  };
  json_mapper.emplace("txouts", func_table);
  item_list.push_back("txouts");
}